

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * create_terminal_action_spec(FMStructDescList format_list)

{
  long in_RDI;
  char *str;
  int i;
  int format_count;
  FMStructDescRec *in_stack_00000028;
  char *in_stack_00000030;
  char *local_18;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  while (*(long *)(in_RDI + (long)(int)uVar2 * 0x20) != 0) {
    uVar2 = uVar2 + 1;
  }
  local_18 = (char *)INT_CMmalloc(CONCAT44(uVar2,in_stack_fffffffffffffff0));
  sprintf(local_18,"Terminal Action   Format Count %d\n",(ulong)uVar2);
  for (iVar1 = 0; iVar1 < (int)uVar2; iVar1 = iVar1 + 1) {
    local_18 = add_FMfieldlist_to_string(in_stack_00000030,in_stack_00000028);
  }
  return local_18;
}

Assistant:

char *
create_terminal_action_spec(FMStructDescList format_list)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list[format_count].format_name != NULL) format_count++;
    str = malloc(50);
    sprintf(str, "Terminal Action   Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }
    return str;
}